

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reduction.hpp
# Opt level: O0

void mxx::
     local_exscan<__gnu_cxx::__normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,std::plus<unsigned_long>>
               (__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                begin,__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                      end,unsigned_long *out)

{
  T TVar1;
  bool bVar2;
  difference_type dVar3;
  reference puVar4;
  reference puVar5;
  T tmp;
  T val;
  unsigned_long *local_30;
  plus<unsigned_long> local_21;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_20;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  out_local;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  end_local;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  begin_local;
  
  val = (T)end._M_current;
  local_30 = begin._M_current;
  local_20._M_current = out;
  out_local._M_current = end._M_current;
  end_local._M_current = begin._M_current;
  dVar3 = std::
          distance<__gnu_cxx::__normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                    (begin,end);
  if (dVar3 != 0) {
    puVar4 = __gnu_cxx::
             __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
             ::operator*(&end_local);
    tmp = *puVar4;
    puVar5 = __gnu_cxx::
             __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
             ::operator*(&local_20);
    *puVar5 = 0;
    __gnu_cxx::
    __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
    ::operator++(&end_local);
    __gnu_cxx::
    __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
    ::operator++(&local_20);
    while (bVar2 = __gnu_cxx::operator!=
                             (&end_local,
                              (__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                               *)&out_local), TVar1 = tmp, bVar2) {
      puVar4 = __gnu_cxx::
               __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
               ::operator*(&end_local);
      tmp = std::plus<unsigned_long>::operator()(&local_21,&tmp,puVar4);
      puVar5 = __gnu_cxx::
               __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
               ::operator*(&local_20);
      *puVar5 = TVar1;
      __gnu_cxx::
      __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
      ::operator++(&end_local);
      __gnu_cxx::
      __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
      ::operator++(&local_20);
    }
  }
  return;
}

Assistant:

void local_exscan(InIterator begin, InIterator end, OutIterator out, Func func) {
    // return if there's nothing here
    if (std::distance(begin, end) == 0)
        return;
    typedef typename std::iterator_traits<OutIterator>::value_type T;

    // start from first element
    T val = *begin;
    *out = T();
    ++begin;
    ++out;

    // calculate the exclusive prefix sum
    while (begin != end) {
        T tmp = val;
        val = func(val,*begin);
        *out = tmp;
        ++begin;
        ++out;
    }
}